

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

void __thiscall NNTreeIterator::increment(NNTreeIterator *this,bool backward)

{
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *this_00;
  uint uVar1;
  NNTreeDetails *pNVar2;
  QPDF *qpdf;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long *plVar10;
  ulong uVar11;
  long *plVar12;
  _Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *p_Var13;
  undefined8 uVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  uint __len;
  QPDFObjectHandle QVar16;
  QPDFObjectHandle pe_node;
  QPDFObjectHandle items;
  undefined1 local_108 [40];
  element_type *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  QPDFObjectHandle local_d0;
  uint local_c0;
  int local_bc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8 [2];
  _Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  local_a8;
  QPDFObjectHandle local_78;
  QPDFObjectHandle local_68;
  QPDF *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_50;
  ulong local_48;
  QPDFObjectHandle local_40;
  
  if (this->item_number < 0) {
    local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this->impl->oh).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->impl->oh).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_68.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_68.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    deepen(this,&local_68,!backward,true);
    if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  else {
    iVar7 = this->item_number;
    if (-1 < iVar7) {
      local_48 = (ulong)!backward;
      local_bc = (uint)!backward * 4 + -2;
      local_e0 = (element_type *)&this->node;
      local_50 = &(this->node).super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      this_00 = &this->path;
      local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        this->item_number = iVar7 + local_bc;
        (*(code *)**(undefined8 **)this->impl->details)();
        QPDFObjectHandle::getKey(&local_d0,(string *)local_e0);
        iVar7 = this->item_number;
        if ((iVar7 < 0) || (iVar8 = QPDFObjectHandle::getArrayNItems(&local_d0), iVar8 <= iVar7)) {
          local_108._0_8_ =
               (_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                *)0x0;
          local_108._8_8_ = (element_type *)0x0;
          (this->node).super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (local_50,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
          this->item_number = -1;
          updateIValue(this,true);
          if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          }
          bVar5 = false;
          do {
            if ((this_00->
                super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)this_00)
            break;
            getNextKid((NNTreeIterator *)local_108,(PathElement *)this,
                       (bool)((char)(this->path).
                                    super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                                    ._M_impl._M_node.super__List_node_base._M_prev + '\x10'));
            bVar4 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_108);
            if (bVar4) {
              std::__cxx11::
              list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::
              _M_erase(this_00,(this->path).
                               super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                               ._M_impl._M_node.super__List_node_base._M_prev);
            }
            else {
              local_78.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_108._0_8_;
              local_78.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
              if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)(local_108._8_8_ + 8) = *(int *)(local_108._8_8_ + 8) + 1;
                }
              }
              bVar5 = deepen(this,&local_78,SUB81(local_48,0),false);
              if ((element_type *)
                  local_78.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_78.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
            if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
            }
          } while (bVar5 == false);
        }
        if (this->item_number < 0) {
LAB_0012c015:
          uVar11 = (ulong)local_d8._M_pi & 0xffffffff;
        }
        else {
          (*(code *)**(undefined8 **)this->impl->details)();
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_108,(string *)local_e0);
          _Var15._M_pi = local_d0.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi;
          local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
          local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_108._0_8_;
          local_108._0_8_ =
               (_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                *)0x0;
          local_108._8_8_ = (element_type *)0x0;
          p_Var13 = (_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     *)(local_108 + 0x10);
          if ((element_type *)_Var15._M_pi != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
          }
          if ((element_type *)local_108._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
          }
          iVar7 = this->item_number;
          iVar8 = QPDFObjectHandle::getArrayNItems(&local_d0);
          if (iVar8 <= iVar7 + 1) {
            qpdf = this->impl->qpdf;
            local_108._0_8_ = p_Var13;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_108,"items array doesn\'t have enough elements","");
            warn(qpdf,(QPDFObjectHandle *)local_e0,(string *)local_108);
            uVar14 = local_108._16_8_;
            _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._0_8_;
            if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 *)local_108._0_8_ != p_Var13) {
LAB_0012c00d:
              operator_delete(_Var15._M_pi,(ulong)((long)&((_List_node_base *)uVar14)->_M_next + 1))
              ;
            }
            goto LAB_0012c015;
          }
          pNVar2 = this->impl->details;
          QVar16 = QPDFObjectHandle::getArrayItem(&local_40,(int)&local_d0);
          cVar6 = (**(code **)(*(long *)pNVar2 + 8))
                            (pNVar2,&local_40,
                             QVar16.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
          if (local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          uVar11 = CONCAT71((int7)((ulong)p_Var13 >> 8),1);
          if (cVar6 == '\0') {
            uVar1 = this->item_number;
            local_c0 = -uVar1;
            if (0 < (int)uVar1) {
              local_c0 = uVar1;
            }
            __len = 1;
            if (9 < local_c0) {
              uVar11 = (ulong)local_c0;
              uVar3 = 4;
              do {
                __len = uVar3;
                uVar9 = (uint)uVar11;
                if (uVar9 < 100) {
                  __len = __len - 2;
                  goto LAB_0012beaf;
                }
                if (uVar9 < 1000) {
                  __len = __len - 1;
                  goto LAB_0012beaf;
                }
                if (uVar9 < 10000) goto LAB_0012beaf;
                uVar11 = uVar11 / 10000;
                uVar3 = __len + 4;
              } while (99999 < uVar9);
              __len = __len + 1;
            }
LAB_0012beaf:
            local_58 = this->impl->qpdf;
            local_b8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_a8;
            std::__cxx11::string::_M_construct
                      ((ulong)local_b8,(char)__len - (char)((int)uVar1 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((long)&(local_b8[0]._M_pi)->_vptr__Sp_counted_base +
                               (ulong)(uVar1 >> 0x1f)),__len,local_c0);
            plVar10 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x282b6b);
            plVar12 = plVar10 + 2;
            if ((long *)*plVar10 == plVar12) {
              local_a8._32_8_ = *plVar12;
              local_a8._40_8_ = plVar10[3];
              local_a8._16_8_ = (void *)((long)&local_a8 + 0x20);
            }
            else {
              local_a8._32_8_ = *plVar12;
              local_a8._16_8_ = (long *)*plVar10;
            }
            local_a8._24_8_ = plVar10[1];
            *plVar10 = (long)plVar12;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)((long)&local_a8 + 0x10));
            p_Var13 = (_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       *)(plVar10 + 2);
            if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 *)*plVar10 == p_Var13) {
              local_108._16_8_ = *(undefined8 *)p_Var13;
              local_108._24_8_ = plVar10[3];
              local_108._0_8_ =
                   (_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    *)(local_108 + 0x10);
            }
            else {
              local_108._16_8_ = *(undefined8 *)p_Var13;
              local_108._0_8_ =
                   (_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    *)*plVar10;
            }
            local_108._8_8_ = plVar10[1];
            *plVar10 = (long)p_Var13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            warn(local_58,(QPDFObjectHandle *)local_e0,(string *)local_108);
            if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 *)local_108._0_8_ !=
                (_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 *)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
            }
            if ((void *)local_a8._16_8_ != (void *)((long)&local_a8 + 0x20)) {
              operator_delete((void *)local_a8._16_8_,local_a8._32_8_ + 1);
            }
            uVar14 = local_a8._0_8_;
            _Var15._M_pi = local_b8[0]._M_pi;
            if ((_Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                 *)local_b8[0]._M_pi != &local_a8) goto LAB_0012c00d;
            goto LAB_0012c015;
          }
        }
        if ((element_type *)
            local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        iVar7 = this->item_number;
      } while ((-1 < iVar7) &&
              (local_d8._M_pi =
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar11 & 0xffffffff),
              (uVar11 & 1) == 0));
    }
  }
  return;
}

Assistant:

void
NNTreeIterator::increment(bool backward)
{
    if (this->item_number < 0) {
        QTC::TC("qpdf", "NNTree increment end()");
        deepen(impl.oh, !backward, true);
        return;
    }
    bool found_valid_key = false;
    while (valid() && (!found_valid_key)) {
        this->item_number += backward ? -2 : 2;
        auto items = this->node.getKey(impl.details.itemsKey());
        if ((this->item_number < 0) || (this->item_number >= items.getArrayNItems())) {
            bool found = false;
            setItemNumber(QPDFObjectHandle(), -1);
            while (!(found || this->path.empty())) {
                auto& element = this->path.back();
                auto pe_node = getNextKid(element, backward);
                if (pe_node.isNull()) {
                    this->path.pop_back();
                } else {
                    found = deepen(pe_node, !backward, false);
                }
            }
        }
        if (this->item_number >= 0) {
            items = this->node.getKey(impl.details.itemsKey());
            if (this->item_number + 1 >= items.getArrayNItems()) {
                QTC::TC("qpdf", "NNTree skip item at end of short items");
                warn(impl.qpdf, this->node, "items array doesn't have enough elements");
            } else if (!impl.details.keyValid(items.getArrayItem(this->item_number))) {
                QTC::TC("qpdf", "NNTree skip invalid key");
                warn(
                    impl.qpdf,
                    this->node,
                    ("item " + std::to_string(this->item_number) + " has the wrong type"));
            } else {
                found_valid_key = true;
            }
        }
    }
}